

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O2

void mbedtls_hmac_drbg_update(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t add_len)

{
  uchar *input;
  byte bVar1;
  ulong ilen;
  byte local_89;
  uchar *local_88;
  size_t local_80;
  uchar K [64];
  
  bVar1 = mbedtls_md_get_size((ctx->md_ctx).md_info);
  ilen = (ulong)bVar1;
  input = ctx->V;
  local_88 = additional;
  local_80 = add_len;
  for (local_89 = 0; local_89 < (byte)((add_len != 0 && additional != (uchar *)0x0) + 1U);
      local_89 = local_89 + 1) {
    mbedtls_md_hmac_reset(&ctx->md_ctx);
    mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen);
    mbedtls_md_hmac_update(&ctx->md_ctx,&local_89,1);
    if (add_len != 0 && additional != (uchar *)0x0) {
      mbedtls_md_hmac_update(&ctx->md_ctx,local_88,local_80);
    }
    mbedtls_md_hmac_finish(&ctx->md_ctx,K);
    mbedtls_md_hmac_starts(&ctx->md_ctx,K,ilen);
    mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen);
    mbedtls_md_hmac_finish(&ctx->md_ctx,input);
  }
  return;
}

Assistant:

void mbedtls_hmac_drbg_update( mbedtls_hmac_drbg_context *ctx,
                       const unsigned char *additional, size_t add_len )
{
    size_t md_len = mbedtls_md_get_size( ctx->md_ctx.md_info );
    unsigned char rounds = ( additional != NULL && add_len != 0 ) ? 2 : 1;
    unsigned char sep[1];
    unsigned char K[MBEDTLS_MD_MAX_SIZE];

    for( sep[0] = 0; sep[0] < rounds; sep[0]++ )
    {
        /* Step 1 or 4 */
        mbedtls_md_hmac_reset( &ctx->md_ctx );
        mbedtls_md_hmac_update( &ctx->md_ctx, ctx->V, md_len );
        mbedtls_md_hmac_update( &ctx->md_ctx, sep, 1 );
        if( rounds == 2 )
            mbedtls_md_hmac_update( &ctx->md_ctx, additional, add_len );
        mbedtls_md_hmac_finish( &ctx->md_ctx, K );

        /* Step 2 or 5 */
        mbedtls_md_hmac_starts( &ctx->md_ctx, K, md_len );
        mbedtls_md_hmac_update( &ctx->md_ctx, ctx->V, md_len );
        mbedtls_md_hmac_finish( &ctx->md_ctx, ctx->V );
    }
}